

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_plp_push(bam_plp_t iter,bam1_t *b)

{
  uint *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  kh_olap_hash_t *h;
  lbnode_t *plVar4;
  ulong uVar5;
  uint8_t *__s2;
  khint32_t *pkVar6;
  lbnode_t *plVar7;
  ulong uVar8;
  olap_hash_t *poVar9;
  uint64_t uVar10;
  mempool_t *pmVar11;
  bool bVar12;
  uint8_t uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  khint_t kVar17;
  __linkbuf_t *p_Var18;
  bam_pileup1_t *pbVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  uint8_t *puVar23;
  int *piVar24;
  undefined1 *puVar25;
  uint *puVar26;
  int *_pos;
  int iVar27;
  undefined1 uVar28;
  uint uVar29;
  khint_t kVar30;
  uint *_tid;
  uint uVar31;
  bam_plp_t iter_00;
  uint uVar32;
  int iVar33;
  khint_t kVar34;
  ulong uVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  khint_t kVar39;
  uint uVar40;
  long lVar41;
  uint *puVar42;
  bool bVar43;
  int *local_90;
  int local_68;
  
  if (iter->error != 0) {
    return -1;
  }
  if (b == (bam1_t *)0x0) {
    iter->is_eof = 1;
    return 0;
  }
  iVar16 = (b->core).tid;
  if (((iVar16 < 0) || (((b->core).field_0xc & 4) != 0)) ||
     ((iter->tid == iVar16 && ((iter->pos == (b->core).pos && (iter->maxcnt < iter->mp->cnt)))))) {
    overlap_remove(iter,b);
    return 0;
  }
  bam_copy1(&iter->tail->b,b);
  h = iter->overlaps;
  if (h == (kh_olap_hash_t *)0x0) goto LAB_00142a3f;
  plVar4 = iter->tail;
  uVar5 = *(ulong *)&(plVar4->b).core.field_0x8;
  if ((uVar5 & 0xa00000000) != 0x200000000) goto LAB_00142a3f;
  iVar16 = (plVar4->b).core.l_qseq;
  iVar36 = (plVar4->b).core.isize;
  iVar15 = -iVar36;
  if (0 < iVar36) {
    iVar15 = iVar36;
  }
  if (iVar16 * 2 <= iVar15) goto LAB_00142a3f;
  __s2 = (plVar4->b).data;
  uVar38 = h->n_buckets;
  if (uVar38 == 0) {
    uVar35 = 0;
  }
  else {
    uVar40 = (uint)(char)*__s2;
    if (*__s2 == '\0') {
      uVar40 = 0;
    }
    else {
      uVar13 = __s2[1];
      if (uVar13 != '\0') {
        puVar23 = __s2 + 2;
        do {
          uVar40 = (int)(char)uVar13 + uVar40 * 0x1f;
          uVar13 = *puVar23;
          puVar23 = puVar23 + 1;
        } while (uVar13 != '\0');
      }
    }
    uVar40 = uVar40 & uVar38 - 1;
    pkVar6 = h->flags;
    iVar36 = 1;
    uVar32 = uVar40;
    do {
      uVar37 = pkVar6[uVar32 >> 4];
      bVar20 = (char)uVar32 * '\x02' & 0x1e;
      uVar14 = uVar37 >> bVar20;
      if (((uVar14 & 2) != 0) ||
         (((uVar14 & 1) == 0 && (iVar15 = strcmp(h->keys[uVar32],(char *)__s2), iVar15 == 0)))) {
        uVar35 = (ulong)uVar32;
        if ((uVar37 >> bVar20 & 3) != 0) {
          uVar35 = (ulong)uVar38;
        }
        break;
      }
      uVar32 = uVar32 + iVar36 & uVar38 - 1;
      iVar36 = iVar36 + 1;
      uVar35 = (ulong)uVar38;
    } while (uVar32 != uVar40);
  }
  uVar40 = (uint)uVar35;
  if (uVar40 != uVar38) {
    plVar7 = h->vals[uVar35];
    uVar8 = *(ulong *)&(plVar7->b).core.field_0x8;
    puVar26 = (uint *)((plVar7->b).data + (uVar8 >> 0x18 & 0xff));
    _tid = puVar26 + (uVar8 >> 0x30);
    local_68 = (plVar4->b).core.pos;
    uVar38 = local_68 - (plVar7->b).core.pos;
    bVar43 = true;
    bVar12 = true;
    if ((int)uVar38 < 0) {
      uVar32 = 0;
      iVar36 = -1;
      local_90 = (int *)0x0;
    }
    else {
      local_90 = (int *)0xffffffff;
      if (uVar8 < 0x1000000000000) {
        uVar32 = 0;
        uVar38 = 0;
      }
      else {
        piVar24 = (int *)0x0;
        uVar37 = uVar38;
        uVar38 = 0;
        do {
          uVar32 = *puVar26;
          uVar14 = uVar32 & 0xf;
          iter_00 = (bam_plp_t)(ulong)uVar14;
          uVar29 = uVar32 >> 4;
          if (uVar14 == 4) {
LAB_0014231f:
            piVar24 = (int *)(ulong)((int)piVar24 + uVar29);
LAB_00142336:
            puVar26 = puVar26 + 1;
            bVar43 = true;
            uVar32 = 0;
          }
          else {
            if (uVar14 - 5 < 2) goto LAB_00142336;
            if ((uVar32 & 7) == 0 || uVar14 == 7) {
              uVar14 = uVar37 - uVar29;
              bVar43 = -1 < (int)uVar14;
              uVar32 = uVar37;
              if (bVar43) {
                puVar26 = puVar26 + 1;
                uVar37 = uVar29;
                uVar32 = 0;
              }
              uVar38 = uVar38 + uVar37;
              piVar24 = (int *)(ulong)((int)piVar24 + uVar37);
              uVar37 = uVar14;
            }
            else {
              if (uVar14 == 1) goto LAB_0014231f;
              if ((uVar32 & 0xe) != 2) {
                bam_plp_push_cold_1();
                goto LAB_00142b7b;
              }
              uVar37 = uVar37 - uVar29;
              uVar32 = 0;
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              puVar26 = puVar26 + 1;
              uVar38 = uVar38 + uVar29;
              bVar43 = true;
            }
          }
          if (!bVar43) {
            iVar36 = 0;
            local_90 = piVar24;
            bVar12 = bVar43;
            goto LAB_00142599;
          }
        } while (puVar26 < _tid);
      }
      iVar36 = -1;
      bVar12 = bVar43;
    }
LAB_00142599:
    if (!bVar12) {
      puVar42 = (uint *)(__s2 + (uVar5 >> 0x18 & 0xff));
      puVar1 = puVar42 + (uVar5 >> 0x30);
      uVar37 = 0;
      piVar24 = (int *)CONCAT71((int7)(uVar5 >> 8),0xffffffffffff < uVar5);
      if (uVar5 < 0x1000000000000) {
        iVar33 = 0;
        iVar15 = -1;
      }
      else {
        uVar14 = 0;
        iVar33 = 0;
        iVar27 = 0;
        do {
          uVar37 = *puVar42;
          uVar31 = uVar37 & 0xf;
          iter_00 = (bam_plp_t)(ulong)uVar31;
          uVar29 = uVar37 >> 4;
          if (uVar31 == 4) {
            iVar27 = iVar27 + uVar29;
LAB_0014260c:
            puVar42 = puVar42 + 1;
            bVar43 = true;
            uVar37 = 0;
          }
          else {
            if (uVar31 - 5 < 2) goto LAB_0014260c;
            if ((uVar37 & 7) == 0 || uVar31 == 7) {
              bVar43 = -1 < (int)(uVar14 - uVar29);
              uVar37 = uVar14;
              uVar31 = uVar14;
              if (bVar43) {
                puVar42 = puVar42 + 1;
                uVar37 = 0;
                uVar31 = uVar29;
              }
              iVar33 = iVar33 + uVar31;
              uVar14 = uVar14 - uVar29;
              uVar29 = uVar31;
LAB_001426a3:
              iVar27 = iVar27 + uVar29;
            }
            else {
              if (uVar31 == 1) {
                puVar42 = puVar42 + 1;
                bVar43 = true;
                uVar37 = 0;
                goto LAB_001426a3;
              }
              if ((uVar37 & 0xe) != 2) goto LAB_00142b7b;
              uVar14 = uVar14 - uVar29;
              uVar37 = 0;
              if ((int)uVar14 < 1) {
                uVar14 = 0;
              }
              puVar42 = puVar42 + 1;
              iVar33 = iVar33 + uVar29;
              bVar43 = true;
            }
          }
          iVar15 = iVar27;
        } while ((bVar43) &&
                (piVar24 = (int *)CONCAT71((int7)((ulong)piVar24 >> 8),puVar42 < puVar1),
                iVar15 = -1, puVar42 < puVar1));
      }
      if ((char)piVar24 != '\0') {
        iVar27 = (plVar7->b).core.l_qseq + 1 >> 1;
        iVar16 = iVar16 + 1 >> 1;
LAB_001426ec:
        if (-1 < (int)uVar38) {
          piVar24 = local_90;
          do {
            local_90 = piVar24;
            if (local_68 - (plVar7->b).core.pos <= (int)uVar38) break;
            local_90 = (int *)0xffffffff;
            for (; puVar26 < _tid; puVar26 = puVar26 + 1) {
              uVar14 = *puVar26;
              uVar31 = uVar14 & 0xf;
              uVar29 = uVar14 >> 4;
              if ((uVar14 & 7) == 0 || uVar31 == 7) {
                if ((int)uVar32 < (int)(uVar29 - 1)) {
                  uVar32 = uVar32 + 1;
                  uVar38 = uVar38 + 1;
                  iVar36 = 0;
                  local_90 = (int *)(ulong)((int)piVar24 + 1);
                  goto LAB_00142792;
                }
              }
              else if ((uVar14 & 0xe) == 2) {
                uVar38 = uVar38 + uVar29;
              }
              else if ((uVar31 == 4) || (uVar31 == 1)) {
                piVar24 = (int *)(ulong)((int)piVar24 + uVar29);
              }
              else if (1 < uVar31 - 5) {
                bam_plp_push_cold_3();
                goto LAB_00142b52;
              }
              uVar32 = 0;
            }
            uVar38 = 0xffffffff;
            iVar36 = -1;
LAB_00142792:
            piVar24 = local_90;
          } while (-1 < (int)uVar38);
        }
        if (-1 < iVar36) {
          iVar21 = (plVar7->b).core.pos + uVar38;
          if (local_68 <= iVar21) {
            local_68 = iVar21;
          }
          if ((iVar33 < 0) || (iVar22 = local_68 - (plVar4->b).core.pos, iVar22 <= iVar33)) {
            bVar43 = false;
          }
          else {
            do {
              bVar43 = true;
              for (; puVar42 < puVar1; puVar42 = puVar42 + 1) {
                uVar14 = *puVar42;
                uVar31 = uVar14 & 0xf;
                uVar29 = uVar14 >> 4;
                if ((uVar14 & 7) == 0 || uVar31 == 7) {
                  if ((int)uVar37 < (int)(uVar29 - 1)) {
                    iVar15 = iVar15 + 1;
                    uVar37 = uVar37 + 1;
                    iVar33 = iVar33 + 1;
                    bVar43 = false;
                    goto LAB_00142878;
                  }
                }
                else if ((uVar14 & 0xe) == 2) {
                  iVar33 = iVar33 + uVar29;
                }
                else if ((uVar31 == 4) || (uVar31 == 1)) {
                  iVar15 = iVar15 + uVar29;
                }
                else if (1 < uVar31 - 5) goto LAB_00142b52;
                uVar37 = 0;
              }
              iVar33 = -1;
              iVar15 = -1;
LAB_00142878:
            } while ((-1 < iVar33) && (iVar33 < iVar22));
          }
          if (bVar43) goto LAB_00142983;
          iVar22 = (plVar4->b).core.pos + iVar33;
          if (local_68 <= iVar22) {
            local_68 = iVar22;
          }
          local_68 = local_68 + 1;
          if (iVar21 == iVar22) {
            iVar21 = (int)local_90;
            puVar2 = (undefined1 *)((long)_tid + (long)iVar21 + (long)iVar27);
            bVar20 = *(byte *)((long)_tid + (long)iVar21 + (long)iVar27);
            lVar41 = (long)iVar15;
            if (((*(byte *)((long)puVar1 + (long)(iVar15 >> 1)) >> (~((char)iVar15 * '\x04') & 4U) ^
                 *(byte *)((long)_tid + (long)(iVar21 >> 1)) >> (~((char)local_90 * '\x04') & 4U)) &
                0xf) == 0) {
              puVar25 = (undefined1 *)((long)puVar1 + lVar41 + iVar16);
              uVar14 = (uint)*(byte *)((long)puVar1 + lVar41 + iVar16) + (uint)bVar20;
              uVar28 = (undefined1)uVar14;
              if (199 < uVar14) {
                uVar28 = 200;
              }
              *puVar2 = uVar28;
            }
            else {
              puVar25 = (undefined1 *)((long)puVar1 + lVar41 + iVar16);
              bVar3 = *(byte *)((long)puVar1 + lVar41 + iVar16);
              if (bVar20 < bVar3) {
                *puVar25 = (char)(int)((double)bVar3 * 0.8);
                puVar25 = puVar2;
              }
              else {
                *puVar2 = (char)(int)((double)bVar20 * 0.8);
              }
            }
            *puVar25 = 0;
          }
          goto LAB_001426ec;
        }
      }
    }
LAB_00142983:
    poVar9 = iter->overlaps;
    if (poVar9->n_buckets != uVar40) {
      uVar38 = poVar9->flags[uVar35 >> 4];
      uVar40 = uVar40 * 2 & 0x1e;
      if ((uVar38 >> (sbyte)uVar40 & 3) == 0) {
        poVar9->flags[uVar35 >> 4] = uVar38 | 1 << uVar40;
        poVar9->size = poVar9->size - 1;
      }
    }
    if (plVar7->end + -1 != (plVar7->s).end) {
LAB_00142b57:
      __assert_fail("a->end-1 == a->s.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                    ,0x66e,"void overlap_push(bam_plp_t, lbnode_t *)");
    }
    iVar16 = (plVar7->b).core.pos;
    uVar5 = *(ulong *)&(plVar7->b).core.field_0x8;
    iVar36 = 0;
    if (0xffffffffffff < uVar5) {
      uVar35 = 0;
      iVar36 = 0;
      do {
        uVar38 = *(uint *)((plVar7->b).data + uVar35 * 4 + (uVar5 >> 0x18 & 0xff));
        iVar36 = iVar36 + (uVar38 >> 4 &
                          (int)((0x3c1a7U >> ((char)uVar38 * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
        uVar35 = uVar35 + 1;
      } while (uVar5 >> 0x30 != uVar35);
    }
    plVar7->end = iVar36 + iVar16;
    (plVar7->s).end = iVar16 + iVar36 + -1;
    goto LAB_00142a3f;
  }
  if (h->n_occupied < h->upper_bound) {
LAB_001423d2:
    kVar30 = h->n_buckets;
    uVar38 = (uint)(char)*__s2;
    if (*__s2 == '\0') {
      uVar38 = 0;
    }
    else {
      uVar13 = __s2[1];
      if (uVar13 != '\0') {
        puVar23 = __s2 + 2;
        do {
          uVar38 = (int)(char)uVar13 + uVar38 * 0x1f;
          uVar13 = *puVar23;
          puVar23 = puVar23 + 1;
        } while (uVar13 != '\0');
      }
    }
    kVar39 = uVar38 & kVar30 - 1;
    pkVar6 = h->flags;
    if ((pkVar6[kVar39 >> 4] >> ((char)kVar39 * '\x02' & 0x1fU) & 2) == 0) {
      iVar16 = 1;
      uVar38 = kVar39;
      kVar34 = kVar30;
      do {
        uVar40 = pkVar6[uVar38 >> 4];
        uVar37 = uVar38 * 2 & 0x1e;
        uVar32 = uVar40 >> (sbyte)uVar37;
        kVar17 = kVar30;
        if (((uVar32 & 2) != 0) ||
           (((uVar32 & 1) == 0 && (iVar36 = strcmp(h->keys[uVar38],(char *)__s2), iVar36 == 0))))
        break;
        kVar17 = kVar34;
        if ((uVar40 >> uVar37 & 1) != 0) {
          kVar17 = uVar38;
        }
        uVar38 = uVar38 + iVar16 & kVar30 - 1;
        iVar16 = iVar16 + 1;
        kVar34 = kVar17;
      } while (uVar38 != kVar39);
      kVar39 = kVar17;
      if (kVar17 == kVar30) {
        if (kVar34 == kVar30) {
          kVar34 = uVar38;
        }
        kVar39 = kVar34;
        if ((pkVar6[uVar38 >> 4] >> ((char)uVar38 * '\x02' & 0x1fU) & 2) == 0) {
          kVar39 = uVar38;
        }
      }
    }
    uVar38 = kVar39 >> 4;
    bVar20 = (char)kVar39 * '\x02' & 0x1e;
    if ((pkVar6[uVar38] >> bVar20 & 2) == 0) {
      if ((pkVar6[uVar38] >> bVar20 & 1) != 0) {
        h->keys[kVar39] = (kh_cstr_t)__s2;
        h->flags[uVar38] = h->flags[uVar38] & ~(3 << bVar20);
        h->size = h->size + 1;
      }
    }
    else {
      h->keys[kVar39] = (kh_cstr_t)__s2;
      h->flags[uVar38] = h->flags[uVar38] & ~(3 << bVar20);
      h->size = h->size + 1;
      h->n_occupied = h->n_occupied + 1;
    }
  }
  else {
    if (h->size * 2 < uVar38) {
      kVar30 = uVar38 - 1;
    }
    else {
      kVar30 = uVar38 + 1;
    }
    iVar16 = kh_resize_olap_hash(h,kVar30);
    if (-1 < iVar16) goto LAB_001423d2;
    kVar39 = h->n_buckets;
  }
  iter->overlaps->vals[kVar39] = plVar4;
LAB_00142a3f:
  plVar4 = iter->tail;
  uVar10 = iter->id;
  iter->id = uVar10 + 1;
  (plVar4->b).id = uVar10;
  iVar16 = (b->core).pos;
  plVar4->beg = iVar16;
  uVar5 = *(ulong *)&(b->core).field_0x8;
  iVar36 = 0;
  if (0xffffffffffff < uVar5) {
    uVar35 = 0;
    iVar36 = 0;
    do {
      iVar36 = iVar36 + (*(uint *)(b->data + uVar35 * 4 + (uVar5 >> 0x18 & 0xff)) >> 4 &
                        (int)((0x3c1a7U >>
                              ((char)*(uint *)(b->data + uVar35 * 4 + (uVar5 >> 0x18 & 0xff)) *
                               '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
      uVar35 = uVar35 + 1;
    } while (uVar5 >> 0x30 != uVar35);
  }
  plVar4->end = iVar36 + iVar16;
  plVar4->s = g_cstate_null;
  plVar4 = iter->tail;
  iVar16 = plVar4->end;
  (plVar4->s).end = iVar16 + -1;
  iVar36 = (b->core).tid;
  if (iVar36 < iter->max_tid) {
    bam_plp_push_cold_6();
    return -1;
  }
  if ((iVar36 == iter->max_tid) && (plVar4->beg < iter->max_pos)) {
    bam_plp_push_cold_5();
    return -1;
  }
  iter->max_tid = iVar36;
  iter->max_pos = plVar4->beg;
  if ((iVar16 <= iter->pos) && ((plVar4->b).core.tid <= iter->tid)) {
    return 0;
  }
  pmVar11 = iter->mp;
  pmVar11->cnt = pmVar11->cnt + 1;
  iVar16 = pmVar11->n;
  if ((long)iVar16 == 0) {
    p_Var18 = (__linkbuf_t *)calloc(1,0x58);
  }
  else {
    pmVar11->n = iVar16 + -1;
    p_Var18 = pmVar11->buf[(long)iVar16 + -1];
  }
  plVar4->next = p_Var18;
  iter->tail = p_Var18;
  return 0;
LAB_00142b52:
  bam_plp_push_cold_4();
  goto LAB_00142b57;
LAB_00142b7b:
  bam_plp_push_cold_2();
  if ((iter_00->func == (bam_plp_auto_f)0x0) || (iter_00->error != 0)) {
LAB_00142b9b:
    *piVar24 = -1;
  }
  else {
    pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,piVar24);
    if (pbVar19 != (bam_pileup1_t *)0x0) goto LAB_00142ba3;
    *piVar24 = 0;
    if (iter_00->is_eof == 0) {
      do {
        iVar16 = (*iter_00->func)(iter_00->data,iter_00->b);
        if (iVar16 < 0) {
          if (iVar16 == -1) {
            if (iter_00->error == 0) {
              iter_00->is_eof = 1;
            }
            pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,piVar24);
            return (int)pbVar19;
          }
          iter_00->error = iVar16;
          goto LAB_00142b9b;
        }
        iVar16 = bam_plp_push(iter_00,iter_00->b);
        if (iVar16 < 0) goto LAB_00142b9b;
        pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,piVar24);
      } while (pbVar19 == (bam_pileup1_t *)0x0);
      goto LAB_00142ba3;
    }
  }
  pbVar19 = (bam_pileup1_t *)0x0;
LAB_00142ba3:
  return (int)pbVar19;
}

Assistant:

int bam_plp_push(bam_plp_t iter, const bam1_t *b)
{
    if (iter->error) return -1;
    if (b) {
        if (b->core.tid < 0) { overlap_remove(iter, b); return 0; }
        // Skip only unmapped reads here, any additional filtering must be done in iter->func
        if (b->core.flag & BAM_FUNMAP) { overlap_remove(iter, b); return 0; }
        if (iter->tid == b->core.tid && iter->pos == b->core.pos && iter->mp->cnt > iter->maxcnt)
        {
            overlap_remove(iter, b);
            return 0;
        }
        bam_copy1(&iter->tail->b, b);
        overlap_push(iter, iter->tail);
#ifndef BAM_NO_ID
        iter->tail->b.id = iter->id++;
#endif
        iter->tail->beg = b->core.pos;
        iter->tail->end = b->core.pos + bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b));
        iter->tail->s = g_cstate_null; iter->tail->s.end = iter->tail->end - 1; // initialize cstate_t
        if (b->core.tid < iter->max_tid) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (chromosomes out of order)\n");
            iter->error = 1;
            return -1;
        }
        if ((b->core.tid == iter->max_tid) && (iter->tail->beg < iter->max_pos)) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (reads out of order)\n");
            iter->error = 1;
            return -1;
        }
        iter->max_tid = b->core.tid; iter->max_pos = iter->tail->beg;
        if (iter->tail->end > iter->pos || iter->tail->b.core.tid > iter->tid) {
            iter->tail->next = mp_alloc(iter->mp);
            iter->tail = iter->tail->next;
        }
    } else iter->is_eof = 1;
    return 0;
}